

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_FraigNodeAddToSolver(Ivy_FraigMan_t *p,Ivy_Obj_t *pOld,Ivy_Obj_t *pNew)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Ivy_Obj_t *pObj;
  Vec_Ptr_t *pVVar3;
  Ivy_Obj_t *pIVar4;
  int local_48;
  int fUseMuxes;
  int k;
  int i;
  Ivy_Obj_t *pFanin;
  Ivy_Obj_t *pNode;
  Vec_Ptr_t *vFanins;
  Vec_Ptr_t *vFrontier;
  Ivy_Obj_t *pNew_local;
  Ivy_Obj_t *pOld_local;
  Ivy_FraigMan_t *p_local;
  
  if ((pOld == (Ivy_Obj_t *)0x0) && (pNew == (Ivy_Obj_t *)0x0)) {
    __assert_fail("pOld || pNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                  ,0x9f6,"void Ivy_FraigNodeAddToSolver(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)"
                 );
  }
  if (((pOld != (Ivy_Obj_t *)0x0) && (pVVar2 = Ivy_ObjFaninVec(pOld), pVVar2 == (Vec_Ptr_t *)0x0))
     || ((pNew != (Ivy_Obj_t *)0x0 && (pVVar2 = Ivy_ObjFaninVec(pNew), pVVar2 == (Vec_Ptr_t *)0x0)))
     ) {
    pVVar2 = Vec_PtrAlloc(100);
    if (pOld != (Ivy_Obj_t *)0x0) {
      Ivy_FraigObjAddToFrontier(p,pOld,pVVar2);
    }
    if (pNew != (Ivy_Obj_t *)0x0) {
      Ivy_FraigObjAddToFrontier(p,pNew,pVVar2);
    }
    for (fUseMuxes = 0; iVar1 = Vec_PtrSize(pVVar2), fUseMuxes < iVar1; fUseMuxes = fUseMuxes + 1) {
      pObj = (Ivy_Obj_t *)Vec_PtrEntry(pVVar2,fUseMuxes);
      iVar1 = Ivy_ObjSatNum(pObj);
      if (iVar1 == 0) {
        __assert_fail("Ivy_ObjSatNum(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                      ,0xa02,
                      "void Ivy_FraigNodeAddToSolver(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
      }
      pVVar3 = Ivy_ObjFaninVec(pObj);
      if (pVVar3 != (Vec_Ptr_t *)0x0) {
        __assert_fail("Ivy_ObjFaninVec(pNode) == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                      ,0xa03,
                      "void Ivy_FraigNodeAddToSolver(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
      }
      iVar1 = Ivy_ObjIsMuxType(pObj);
      if (iVar1 == 0) {
        pNode = (Ivy_Obj_t *)Ivy_FraigCollectSuper(pObj,1);
        for (local_48 = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pNode), local_48 < iVar1;
            local_48 = local_48 + 1) {
          pIVar4 = (Ivy_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pNode,local_48);
          pIVar4 = Ivy_Regular(pIVar4);
          Ivy_FraigObjAddToFrontier(p,pIVar4,pVVar2);
        }
        Ivy_FraigAddClausesSuper(p,pObj,(Vec_Ptr_t *)pNode);
      }
      else {
        pNode = (Ivy_Obj_t *)Vec_PtrAlloc(4);
        pIVar4 = Ivy_ObjFanin0(pObj);
        pIVar4 = Ivy_ObjFanin0(pIVar4);
        Vec_PtrPushUnique((Vec_Ptr_t *)pNode,pIVar4);
        pIVar4 = Ivy_ObjFanin1(pObj);
        pIVar4 = Ivy_ObjFanin0(pIVar4);
        Vec_PtrPushUnique((Vec_Ptr_t *)pNode,pIVar4);
        pIVar4 = Ivy_ObjFanin0(pObj);
        pIVar4 = Ivy_ObjFanin1(pIVar4);
        Vec_PtrPushUnique((Vec_Ptr_t *)pNode,pIVar4);
        pIVar4 = Ivy_ObjFanin1(pObj);
        pIVar4 = Ivy_ObjFanin1(pIVar4);
        Vec_PtrPushUnique((Vec_Ptr_t *)pNode,pIVar4);
        for (local_48 = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pNode), local_48 < iVar1;
            local_48 = local_48 + 1) {
          pIVar4 = (Ivy_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pNode,local_48);
          pIVar4 = Ivy_Regular(pIVar4);
          Ivy_FraigObjAddToFrontier(p,pIVar4,pVVar2);
        }
        Ivy_FraigAddClausesMux(p,pObj);
      }
      iVar1 = Vec_PtrSize((Vec_Ptr_t *)pNode);
      if (iVar1 < 2) {
        __assert_fail("Vec_PtrSize(vFanins) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                      ,0xa16,
                      "void Ivy_FraigNodeAddToSolver(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
      }
      Ivy_ObjSetFaninVec(pObj,(Vec_Ptr_t *)pNode);
    }
    Vec_PtrFree(pVVar2);
    sat_solver_simplify(p->pSat);
  }
  return;
}

Assistant:

void Ivy_FraigNodeAddToSolver( Ivy_FraigMan_t * p, Ivy_Obj_t * pOld, Ivy_Obj_t * pNew )
{ 
    Vec_Ptr_t * vFrontier, * vFanins;
    Ivy_Obj_t * pNode, * pFanin;
    int i, k, fUseMuxes = 1;
    assert( pOld || pNew );
    // quit if CNF is ready
    if ( (!pOld || Ivy_ObjFaninVec(pOld)) && (!pNew || Ivy_ObjFaninVec(pNew)) )
        return;
    // start the frontier
    vFrontier = Vec_PtrAlloc( 100 );
    if ( pOld ) Ivy_FraigObjAddToFrontier( p, pOld, vFrontier );
    if ( pNew ) Ivy_FraigObjAddToFrontier( p, pNew, vFrontier );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Ivy_ObjSatNum(pNode) );
        assert( Ivy_ObjFaninVec(pNode) == NULL );
        if ( fUseMuxes && Ivy_ObjIsMuxType(pNode) )
        {
            vFanins = Vec_PtrAlloc( 4 );
            Vec_PtrPushUnique( vFanins, Ivy_ObjFanin0( Ivy_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Ivy_ObjFanin0( Ivy_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( vFanins, Ivy_ObjFanin1( Ivy_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Ivy_ObjFanin1( Ivy_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Ivy_Obj_t *, vFanins, pFanin, k )
                Ivy_FraigObjAddToFrontier( p, Ivy_Regular(pFanin), vFrontier );
            Ivy_FraigAddClausesMux( p, pNode );
        }
        else
        {
            vFanins = Ivy_FraigCollectSuper( pNode, fUseMuxes );
            Vec_PtrForEachEntry( Ivy_Obj_t *, vFanins, pFanin, k )
                Ivy_FraigObjAddToFrontier( p, Ivy_Regular(pFanin), vFrontier );
            Ivy_FraigAddClausesSuper( p, pNode, vFanins );
        }
        assert( Vec_PtrSize(vFanins) > 1 );
        Ivy_ObjSetFaninVec( pNode, vFanins );
    }
    Vec_PtrFree( vFrontier );
    sat_solver_simplify( p->pSat );
}